

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O2

set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
* anon_unknown.dwarf_642426::GetKeyOriginData
            (set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
             *__return_storage_ptr__,FlatSigningProvider *provider,int flags)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *__v;
  byte bVar2;
  long lVar3;
  _Base_ptr p_Var4;
  size_t __n;
  iterator in_R8;
  KeyOriginInfo *in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined4 local_104;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  KeyOriginInfo norm_origin;
  CPubKey norm_pubkey;
  uchar bytes [33];
  uchar local_47 [15];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (provider->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(provider->origins)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    __v = &p_Var4[1]._M_right;
    if ((flags & 0x40U) == 0) {
      std::
      _Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
      ::_M_insert_unique<std::pair<CPubKey,KeyOriginInfo>const&>
                ((_Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
                  *)__return_storage_ptr__,(pair<CPubKey,_KeyOriginInfo> *)__v);
    }
    else {
      local_e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_d8 = "";
      local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = (iterator)in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x77;
      file.m_begin = (iterator)&local_e0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
      norm_pubkey.vch[8] = '\0';
      norm_pubkey.vch._0_8_ = &PTR__lazy_ostream_01139f30;
      norm_pubkey.vch._16_8_ = boost::unit_test::lazy_ostream::inst;
      norm_pubkey.vch._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_f8 = "";
      norm_origin.fingerprint[0] = '!';
      norm_origin.fingerprint[1] = '\0';
      norm_origin.fingerprint[2] = '\0';
      norm_origin.fingerprint[3] = '\0';
      if ((*(byte *)__v & 0xfe) != 2) {
        bVar2 = *(byte *)__v - 4;
        norm_origin.fingerprint[0] = '\0';
        norm_origin.fingerprint[1] = '\0';
        norm_origin.fingerprint[2] = '\0';
        norm_origin.fingerprint[3] = '\0';
        if (bVar2 < 4) {
          norm_origin.fingerprint = *(uchar (*) [4])(&DAT_00b7c5d0 + (ulong)bVar2 * 4);
        }
      }
      local_104 = 0x21;
      in_R8 = (iterator)0x2;
      in_R9 = &norm_origin;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (&norm_pubkey,&local_100,0x77,1,2,in_R9,"data.first.size()",&local_104,"33");
      bVar2 = *(byte *)__v;
      __n = 0x21;
      if ((bVar2 & 0xfe) == 2) {
LAB_00324be7:
        memmove(bytes,__v,__n);
      }
      else if (bVar2 < 8) {
        __n = 0x41;
        if ((0xd0U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_00324be7;
      }
      bytes[0] = '\x02';
      CPubKey::Set<unsigned_char_const*>(&norm_pubkey,bytes,local_47);
      KeyOriginInfo::KeyOriginInfo(&norm_origin,(KeyOriginInfo *)(p_Var4 + 4));
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        norm_origin.fingerprint[lVar3] = '\0';
      }
      std::
      _Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
      ::_M_emplace_unique<CPubKey&,KeyOriginInfo&>
                ((_Rb_tree<std::pair<CPubKey,KeyOriginInfo>,std::pair<CPubKey,KeyOriginInfo>,std::_Identity<std::pair<CPubKey,KeyOriginInfo>>,std::less<std::pair<CPubKey,KeyOriginInfo>>,std::allocator<std::pair<CPubKey,KeyOriginInfo>>>
                  *)__return_storage_ptr__,&norm_pubkey,&norm_origin);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&norm_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

std::set<std::pair<CPubKey, KeyOriginInfo>> GetKeyOriginData(const FlatSigningProvider& provider, int flags) {
    std::set<std::pair<CPubKey, KeyOriginInfo>> ret;
    for (const auto& [_, data] : provider.origins) {
        if (flags & XONLY_KEYS) {
            unsigned char bytes[33];
            BOOST_CHECK_EQUAL(data.first.size(), 33);
            std::copy(data.first.begin(), data.first.end(), bytes);
            bytes[0] = 0x02;
            CPubKey norm_pubkey{bytes};
            KeyOriginInfo norm_origin = data.second;
            std::fill(std::begin(norm_origin.fingerprint), std::end(norm_origin.fingerprint), 0); // fingerprints don't necessarily match.
            ret.emplace(norm_pubkey, norm_origin);
        } else {
            ret.insert(data);
        }
    }
    return ret;
}